

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matras.c
# Opt level: O1

void * matras_alloc_internal(matras *m)

{
  uint uVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  uint uVar5;
  matras_allocator *pmVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  
  uVar1 = (uint)(m->head).block_count;
  uVar9 = uVar1 >> ((byte)m->shift1 & 0x1f);
  uVar7 = m->mask1 & uVar1;
  uVar5 = uVar7 >> ((byte)m->shift2 & 0x1f);
  uVar8 = m->mask2 & uVar7;
  if (uVar1 == 0) {
    pmVar6 = m->allocator;
    if (pmVar6->num_reserved_extents < 1) {
      puVar2 = (undefined8 *)(*pmVar6->alloc_func)(pmVar6);
    }
    else {
      puVar2 = (undefined8 *)pmVar6->reserved_extents;
      pmVar6->reserved_extents = (void *)*puVar2;
      pmVar6->num_reserved_extents = pmVar6->num_reserved_extents + -1;
    }
    if (puVar2 == (undefined8 *)0x0) {
      return (void *)0x0;
    }
    m->extent_count = m->extent_count + 1;
    m->stats->extent_count = m->stats->extent_count + 1;
    (m->head).root = puVar2;
  }
  else {
    puVar2 = (undefined8 *)(m->head).root;
  }
  if (uVar7 == 0) {
    pmVar6 = m->allocator;
    if (pmVar6->num_reserved_extents < 1) {
      puVar3 = (undefined8 *)(*pmVar6->alloc_func)(pmVar6);
    }
    else {
      puVar3 = (undefined8 *)pmVar6->reserved_extents;
      pmVar6->reserved_extents = (void *)*puVar3;
      pmVar6->num_reserved_extents = pmVar6->num_reserved_extents + -1;
    }
    if (puVar3 == (undefined8 *)0x0) {
      if (uVar1 != 0) {
        return (void *)0x0;
      }
      pmVar6 = m->allocator;
      goto LAB_001052c7;
    }
    m->extent_count = m->extent_count + 1;
    m->stats->extent_count = m->stats->extent_count + 1;
    puVar2[uVar9] = puVar3;
  }
  else {
    puVar3 = (undefined8 *)puVar2[uVar9];
  }
  if (uVar8 == 0) {
    pmVar6 = m->allocator;
    if (pmVar6->num_reserved_extents < 1) {
      puVar4 = (undefined8 *)(*pmVar6->alloc_func)(pmVar6);
    }
    else {
      puVar4 = (undefined8 *)pmVar6->reserved_extents;
      pmVar6->reserved_extents = (void *)*puVar4;
      pmVar6->num_reserved_extents = pmVar6->num_reserved_extents + -1;
    }
    if (puVar4 == (undefined8 *)0x0) {
      if (uVar1 == 0) {
        (*m->allocator->free_func)(m->allocator,puVar2);
        m->extent_count = m->extent_count - 1;
        m->stats->extent_count = m->stats->extent_count - 1;
      }
      if (uVar7 != 0) {
        return (void *)0x0;
      }
      pmVar6 = m->allocator;
      puVar2 = puVar3;
LAB_001052c7:
      (*pmVar6->free_func)(pmVar6,puVar2);
      m->extent_count = m->extent_count - 1;
      m->stats->extent_count = m->stats->extent_count - 1;
      return (void *)0x0;
    }
    m->extent_count = m->extent_count + 1;
    m->stats->extent_count = m->stats->extent_count + 1;
    puVar3[uVar5] = puVar4;
  }
  else {
    puVar4 = (undefined8 *)puVar3[uVar5];
  }
  return (void *)((ulong)(uVar8 * m->block_size) + (long)puVar4);
}

Assistant:

static void *
matras_alloc_internal(struct matras *m)
{
	/* Current block_count is the ID of new block */
	matras_id_t id = m->head.block_count;

	/* See "Shifts and masks explanation" for details */
	/* Additionally we determine if we must allocate extents.
	 * Basically,
	 * if n1 == 0 && n2 == 0 && n3 == 0, we must allocate root extent,
	 * if n2 == 0 && n3 == 0, we must allocate second level extent,
	 * if n3 == 0, we must allocate third level extent.
	 * Optimization:
	 * (n1 == 0 && n2 == 0 && n3 == 0) is identical to (id == 0)
	 * (n2 == 0 && n3 == 0) is identical to (id & mask1 == 0)
	 */
	matras_id_t extent1_available = id;
	matras_id_t n1 = id >> m->shift1;
	id &= m->mask1;
	matras_id_t extent2_available = id;
	matras_id_t n2 = id >> m->shift2;
	id &= m->mask2;
	matras_id_t extent3_available = id;
	matras_id_t n3 = id;

	void **extent1, **extent2;
	char *extent3;

	if (extent1_available) {
		extent1 = (void **)m->head.root;
	} else {
		extent1 = (void **)matras_alloc_extent(m);
		if (!extent1)
			return 0;
		m->head.root = (void *)extent1;
	}

	if (extent2_available) {
		extent2 = (void **)extent1[n1];
	} else {
		extent2 = (void **)matras_alloc_extent(m);
		if (!extent2) {
			if (!extent1_available) /* was created */
				matras_free_extent(m, extent1);
			return 0;
		}
		extent1[n1] = (void *)extent2;
	}

	if (extent3_available) {
		extent3 = (char *)extent2[n2];
	} else {
		extent3 = (char *)matras_alloc_extent(m);
		if (!extent3) {
			if (!extent1_available) /* was created */
				matras_free_extent(m, extent1);
			if (!extent2_available) /* was created */
				matras_free_extent(m, extent2);
			return 0;
		}
		extent2[n2] = (void *)extent3;
	}

	return (void *)(extent3 + n3 * m->block_size);
}